

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderBuiltinVarTests.cpp
# Opt level: O3

int __thiscall deqp::gles3::Functional::VertexIDCase::init(VertexIDCase *this,EVP_PKEY_CTX *ctx)

{
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *this_00;
  float *pfVar1;
  RenderContext *renderCtx;
  pointer pVVar2;
  int iVar3;
  uint uVar4;
  int extraout_EAX;
  undefined4 extraout_var;
  RenderTarget *pRVar5;
  ShaderProgram *pSVar6;
  NotSupportedError *pNVar7;
  TestError *this_01;
  bool bVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  int iVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  ProgramSources sources;
  value_type local_160;
  value_type local_140;
  long local_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined1 local_100 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8 [5];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_70;
  _Vector_impl_data local_50;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pRVar5 = Context::getRenderTarget((this->super_TestCase).m_context);
  uVar9 = pRVar5->m_width;
  pRVar5 = Context::getRenderTarget((this->super_TestCase).m_context);
  if ((int)uVar9 < 0x20) {
    pNVar7 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_100._0_8_ = local_100 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_100,"Too small render target","");
    tcu::NotSupportedError::NotSupportedError(pNVar7,(string *)local_100);
    __cxa_throw(pNVar7,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  uVar9 = uVar9 >> 5;
  uVar4 = 4;
  if (uVar9 < 4) {
    uVar4 = uVar9;
  }
  iVar15 = (((int)(4 / (ulong)uVar9) + 1) - (uint)((int)(4 % (ulong)uVar9) == 0)) * 0x20;
  local_118 = CONCAT44(iVar15,uVar4 << 5);
  uStack_110 = 0;
  if (iVar15 <= pRVar5->m_height) {
    pSVar6 = (ShaderProgram *)operator_new(0xd0);
    renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_140,
               "#version 300 es\nin highp vec4 a_position;\nout mediump vec4 v_color;\nuniform highp vec4 u_colors[24];\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_color = u_colors[gl_VertexID];\n}\n"
               ,"");
    local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
    local_120 = CONCAT44(extraout_var,iVar3);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_160,
               "#version 300 es\nin mediump vec4 v_color;\nlayout(location = 0) out mediump vec4 o_color;\nvoid main (void)\n{\n\to_color = v_color;\n}\n"
               ,"");
    memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_100,0,0xac);
    local_50._0_9_ = SUB169((undefined1  [16])0x0,0);
    local_50._M_finish._1_7_ = 0;
    stack0xffffffffffffffc0 = SUB169((undefined1  [16])0x0,7);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_100,&local_140);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(local_e8,&local_160);
    glu::ShaderProgram::ShaderProgram(pSVar6,renderCtx,(ProgramSources *)local_100);
    this->m_program = pSVar6;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_50);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
              (&local_70);
    lVar10 = local_120;
    lVar12 = 0x78;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_100 + lVar12));
      lVar12 = lVar12 + -0x18;
    } while (lVar12 != -0x18);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                    this->m_program);
    pSVar6 = this->m_program;
    if ((pSVar6->m_program).m_info.linkOk != false) {
      (**(code **)(lVar10 + 0x6c8))(1,&this->m_positionBuffer);
      (**(code **)(lVar10 + 0x6c8))(1,&this->m_elementBuffer);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
                (&this->m_colors,0x18);
      pVVar2 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar2->m_data[0] = 0.0;
      pVVar2->m_data[1] = 0.0;
      pVVar2->m_data[2] = 0.0;
      pVVar2->m_data[3] = 1.0;
      pVVar2 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar2[1].m_data[0] = 0.5;
      pVVar2[1].m_data[1] = 1.0;
      pVVar2[1].m_data[2] = 0.5;
      pVVar2[1].m_data[3] = 1.0;
      pVVar2 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar2[2].m_data[0] = 0.0;
      pVVar2[2].m_data[1] = 0.5;
      pVVar2[2].m_data[2] = 1.0;
      pVVar2[2].m_data[3] = 1.0;
      pVVar2 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar2[3].m_data[0] = 0.0;
      pVVar2[3].m_data[1] = 1.0;
      pVVar2[3].m_data[2] = 0.0;
      pVVar2[3].m_data[3] = 1.0;
      pVVar2 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar2[4].m_data[0] = 0.0;
      pVVar2[4].m_data[1] = 1.0;
      pVVar2[4].m_data[2] = 1.0;
      pVVar2[4].m_data[3] = 1.0;
      pVVar2 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar2[5].m_data[0] = 0.5;
      pVVar2[5].m_data[1] = 0.0;
      pVVar2[5].m_data[2] = 0.0;
      pVVar2[5].m_data[3] = 1.0;
      pVVar2 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar2[6].m_data[0] = 0.5;
      pVVar2[6].m_data[1] = 0.0;
      pVVar2[6].m_data[2] = 1.0;
      pVVar2[6].m_data[3] = 1.0;
      pVVar2 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar2[7].m_data[0] = 0.5;
      pVVar2[7].m_data[1] = 0.0;
      pVVar2[7].m_data[2] = 0.5;
      pVVar2[7].m_data[3] = 1.0;
      pVVar2 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar2[8].m_data[0] = 1.0;
      pVVar2[8].m_data[1] = 0.0;
      pVVar2[8].m_data[2] = 0.0;
      pVVar2[8].m_data[3] = 1.0;
      pVVar2 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar2[9].m_data[0] = 0.5;
      pVVar2[9].m_data[1] = 1.0;
      pVVar2[9].m_data[2] = 0.0;
      pVVar2[9].m_data[3] = 1.0;
      pVVar2 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar2[10].m_data[0] = 0.0;
      pVVar2[10].m_data[1] = 0.5;
      pVVar2[10].m_data[2] = 0.0;
      pVVar2[10].m_data[3] = 1.0;
      pVVar2 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar2[0xb].m_data[0] = 0.5;
      pVVar2[0xb].m_data[1] = 1.0;
      pVVar2[0xb].m_data[2] = 1.0;
      pVVar2[0xb].m_data[3] = 1.0;
      pVVar2 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar2[0xc].m_data[0] = 0.0;
      pVVar2[0xc].m_data[1] = 0.0;
      pVVar2[0xc].m_data[2] = 1.0;
      pVVar2[0xc].m_data[3] = 1.0;
      pVVar2 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar2[0xd].m_data[0] = 1.0;
      pVVar2[0xd].m_data[1] = 0.0;
      pVVar2[0xd].m_data[2] = 0.5;
      pVVar2[0xd].m_data[3] = 1.0;
      pVVar2 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar2[0xe].m_data[0] = 0.0;
      pVVar2[0xe].m_data[1] = 0.5;
      pVVar2[0xe].m_data[2] = 0.5;
      pVVar2[0xe].m_data[3] = 1.0;
      pVVar2 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar2[0xf].m_data[0] = 1.0;
      pVVar2[0xf].m_data[1] = 1.0;
      pVVar2[0xf].m_data[2] = 0.5;
      pVVar2[0xf].m_data[3] = 1.0;
      pVVar2 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar2[0x10].m_data[0] = 1.0;
      pVVar2[0x10].m_data[1] = 0.0;
      pVVar2[0x10].m_data[2] = 1.0;
      pVVar2[0x10].m_data[3] = 1.0;
      pVVar2 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar2[0x11].m_data[0] = 1.0;
      pVVar2[0x11].m_data[1] = 0.5;
      pVVar2[0x11].m_data[2] = 0.0;
      pVVar2[0x11].m_data[3] = 1.0;
      pVVar2 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar2[0x12].m_data[0] = 0.0;
      pVVar2[0x12].m_data[1] = 1.0;
      pVVar2[0x12].m_data[2] = 0.5;
      pVVar2[0x12].m_data[3] = 1.0;
      pVVar2 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar2[0x13].m_data[0] = 1.0;
      pVVar2[0x13].m_data[1] = 0.5;
      pVVar2[0x13].m_data[2] = 1.0;
      pVVar2[0x13].m_data[3] = 1.0;
      pVVar2 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar2[0x14].m_data[0] = 1.0;
      pVVar2[0x14].m_data[1] = 1.0;
      pVVar2[0x14].m_data[2] = 0.0;
      pVVar2[0x14].m_data[3] = 1.0;
      pVVar2 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar2[0x15].m_data[0] = 1.0;
      pVVar2[0x15].m_data[1] = 0.5;
      pVVar2[0x15].m_data[2] = 0.5;
      pVVar2[0x15].m_data[3] = 1.0;
      pVVar2 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar2[0x16].m_data[0] = 0.0;
      pVVar2[0x16].m_data[1] = 0.0;
      pVVar2[0x16].m_data[2] = 0.5;
      pVVar2[0x16].m_data[3] = 1.0;
      pVVar2 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar2[0x17].m_data[0] = 1.0;
      pVVar2[0x17].m_data[1] = 1.0;
      pVVar2[0x17].m_data[2] = 1.0;
      pVVar2[0x17].m_data[3] = 1.0;
      this_00 = &this->m_positions;
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
                (this_00,0x18);
      auVar14._0_4_ = (float)(int)local_118;
      auVar14._4_4_ = (float)local_118._4_4_;
      auVar14._8_4_ = (float)(int)uStack_110;
      auVar14._12_4_ = (float)uStack_110._4_4_;
      auVar14 = divps(_DAT_00ade040,auVar14);
      bVar8 = false;
      lVar10 = 0;
      uVar11 = 0;
      do {
        uVar4 = ((uint)uVar11 & 0xff) / 6;
        fVar18 = (float)(uVar4 % uVar9) * auVar14._0_4_ + -1.0;
        fVar19 = (float)(uVar4 / uVar9) * auVar14._4_4_ + -1.0;
        fVar16 = auVar14._0_4_ + fVar18;
        fVar17 = auVar14._4_4_ + fVar19;
        if (bVar8) {
          pfVar1 = (float *)((long)((this_00->
                                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start)->m_data + lVar10);
          *pfVar1 = fVar16;
          pfVar1[1] = fVar17;
          pfVar1[2] = 0.0;
          pfVar1[3] = 1.0;
          fVar20 = fVar16;
        }
        else {
          pfVar1 = (float *)((long)((this_00->
                                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start)->m_data + lVar10);
          *pfVar1 = fVar18;
          pfVar1[1] = fVar19;
          pfVar1[2] = 0.0;
          pfVar1[3] = 1.0;
          fVar20 = fVar18;
          fVar18 = fVar16;
          fVar19 = fVar17;
        }
        pfVar1 = (float *)((long)(this_00->
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start[1].m_data + lVar10);
        *pfVar1 = fVar18;
        pfVar1[1] = fVar19;
        pfVar1[2] = 0.0;
        pfVar1[3] = 1.0;
        pVVar2 = (this_00->
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start;
        *(float *)((long)pVVar2[2].m_data + lVar10) = fVar20;
        *(float *)((long)pVVar2[2].m_data + lVar10 + 4) = fVar19;
        *(undefined8 *)((long)pVVar2[2].m_data + lVar10 + 8) = 0x3f80000000000000;
        lVar10 = lVar10 + 0x30;
        bVar8 = (bool)(bVar8 ^ 1);
        bVar13 = uVar11 < 0x15;
        uVar11 = uVar11 + 3;
      } while (bVar13);
      this->m_viewportW = (int)local_118;
      this->m_viewportH = iVar15;
      this->m_iterNdx = 0;
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
      return extraout_EAX;
    }
    glu::ShaderProgram::~ShaderProgram(pSVar6);
    operator_delete(pSVar6,0xd0);
    this->m_program = (ShaderProgram *)0x0;
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    local_100._0_8_ = local_100 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"Compile failed","");
    tcu::TestError::TestError(this_01,(string *)local_100);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  pNVar7 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_100._0_8_ = local_100 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"Too small render target","");
  tcu::NotSupportedError::NotSupportedError(pNVar7,(string *)local_100);
  __cxa_throw(pNVar7,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void VertexIDCase::init (void)
{
	const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
	const int				width		= m_context.getRenderTarget().getWidth();
	const int				height		= m_context.getRenderTarget().getHeight();

	const int				quadWidth	= 32;
	const int				quadHeight	= 32;

	if (width < quadWidth)
		throw tcu::NotSupportedError("Too small render target");

	const int				maxQuadsX	= width/quadWidth;
	const int				numVertices	= MAX_VERTICES;

	const int				numQuads	= numVertices/6 + (numVertices%6 != 0 ? 1 : 0);
	const int				viewportW	= de::min(numQuads, maxQuadsX)*quadWidth;
	const int				viewportH	= (numQuads/maxQuadsX + (numQuads%maxQuadsX != 0 ? 1 : 0))*quadHeight;

	if (viewportH > height)
		throw tcu::NotSupportedError("Too small render target");

	DE_ASSERT(viewportW <= width && viewportH <= height);

	DE_ASSERT(!m_program);
	m_program = new glu::ShaderProgram(m_context.getRenderContext(), glu::makeVtxFragSources(
		"#version 300 es\n"
		"in highp vec4 a_position;\n"
		"out mediump vec4 v_color;\n"
		"uniform highp vec4 u_colors[24];\n"
		"void main (void)\n"
		"{\n"
		"	gl_Position = a_position;\n"
		"	v_color = u_colors[gl_VertexID];\n"
		"}\n",

		"#version 300 es\n"
		"in mediump vec4 v_color;\n"
		"layout(location = 0) out mediump vec4 o_color;\n"
		"void main (void)\n"
		"{\n"
		"	o_color = v_color;\n"
		"}\n"));

	m_testCtx.getLog() << *m_program;

	if (!m_program->isOk())
	{
		delete m_program;
		m_program = DE_NULL;
		throw tcu::TestError("Compile failed");
	}

	gl.genBuffers(1, &m_positionBuffer);
	gl.genBuffers(1, &m_elementBuffer);

	// Set colors (in dynamic memory to save static data space).
	m_colors.resize(numVertices);
	m_colors[ 0] = tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f);
	m_colors[ 1] = tcu::Vec4(0.5f, 1.0f, 0.5f, 1.0f);
	m_colors[ 2] = tcu::Vec4(0.0f, 0.5f, 1.0f, 1.0f);
	m_colors[ 3] = tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f);
	m_colors[ 4] = tcu::Vec4(0.0f, 1.0f, 1.0f, 1.0f);
	m_colors[ 5] = tcu::Vec4(0.5f, 0.0f, 0.0f, 1.0f);
	m_colors[ 6] = tcu::Vec4(0.5f, 0.0f, 1.0f, 1.0f);
	m_colors[ 7] = tcu::Vec4(0.5f, 0.0f, 0.5f, 1.0f);
	m_colors[ 8] = tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f);
	m_colors[ 9] = tcu::Vec4(0.5f, 1.0f, 0.0f, 1.0f);
	m_colors[10] = tcu::Vec4(0.0f, 0.5f, 0.0f, 1.0f);
	m_colors[11] = tcu::Vec4(0.5f, 1.0f, 1.0f, 1.0f);
	m_colors[12] = tcu::Vec4(0.0f, 0.0f, 1.0f, 1.0f);
	m_colors[13] = tcu::Vec4(1.0f, 0.0f, 0.5f, 1.0f);
	m_colors[14] = tcu::Vec4(0.0f, 0.5f, 0.5f, 1.0f);
	m_colors[15] = tcu::Vec4(1.0f, 1.0f, 0.5f, 1.0f);
	m_colors[16] = tcu::Vec4(1.0f, 0.0f, 1.0f, 1.0f);
	m_colors[17] = tcu::Vec4(1.0f, 0.5f, 0.0f, 1.0f);
	m_colors[18] = tcu::Vec4(0.0f, 1.0f, 0.5f, 1.0f);
	m_colors[19] = tcu::Vec4(1.0f, 0.5f, 1.0f, 1.0f);
	m_colors[20] = tcu::Vec4(1.0f, 1.0f, 0.0f, 1.0f);
	m_colors[21] = tcu::Vec4(1.0f, 0.5f, 0.5f, 1.0f);
	m_colors[22] = tcu::Vec4(0.0f, 0.0f, 0.5f, 1.0f);
	m_colors[23] = tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f);

	// Compute positions.
	m_positions.resize(numVertices);
	DE_ASSERT(numVertices%3 == 0);
	for (int vtxNdx = 0; vtxNdx < numVertices; vtxNdx += 3)
	{
		const float	h			= 2.0f * float(quadHeight)/float(viewportH);
		const float	w			= 2.0f * float(quadWidth)/float(viewportW);

		const int	triNdx		= vtxNdx/3;
		const int	quadNdx		= triNdx/2;
		const int	quadY		= quadNdx/maxQuadsX;
		const int	quadX		= quadNdx%maxQuadsX;

		const float	x0			= -1.0f + float(quadX)*w;
		const float	y0			= -1.0f + float(quadY)*h;

		if (triNdx%2 == 0)
		{
			m_positions[vtxNdx+0] = tcu::Vec4(x0,   y0,   0.0f, 1.0f);
			m_positions[vtxNdx+1] = tcu::Vec4(x0+w, y0+h, 0.0f, 1.0f);
			m_positions[vtxNdx+2] = tcu::Vec4(x0,   y0+h, 0.0f, 1.0f);
		}
		else
		{
			m_positions[vtxNdx+0] = tcu::Vec4(x0+w, y0+h, 0.0f, 1.0f);
			m_positions[vtxNdx+1] = tcu::Vec4(x0,   y0,   0.0f, 1.0f);
			m_positions[vtxNdx+2] = tcu::Vec4(x0+w, y0,   0.0f, 1.0f);
		}
	}

	m_viewportW	= viewportW;
	m_viewportH	= viewportH;
	m_iterNdx	= 0;

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
}